

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_ARB_sync(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_ARB_sync != 0) {
    glad_glIsSync = (PFNGLISSYNCPROC)(*load)("glIsSync",userptr);
    glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*load)("glGetSynciv",userptr);
    glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*load)("glClientWaitSync",userptr);
    glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*load)("glDeleteSync",userptr);
    glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*load)("glGetInteger64v",userptr);
    glad_glWaitSync = (PFNGLWAITSYNCPROC)(*load)("glWaitSync",userptr);
    glad_glFenceSync = (PFNGLFENCESYNCPROC)(*load)("glFenceSync",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_ARB_sync( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_ARB_sync) return;
    glIsSync = (PFNGLISSYNCPROC) load("glIsSync", userptr);
    glGetSynciv = (PFNGLGETSYNCIVPROC) load("glGetSynciv", userptr);
    glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC) load("glClientWaitSync", userptr);
    glDeleteSync = (PFNGLDELETESYNCPROC) load("glDeleteSync", userptr);
    glGetInteger64v = (PFNGLGETINTEGER64VPROC) load("glGetInteger64v", userptr);
    glWaitSync = (PFNGLWAITSYNCPROC) load("glWaitSync", userptr);
    glFenceSync = (PFNGLFENCESYNCPROC) load("glFenceSync", userptr);
}